

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vs_wrapper.hpp
# Opt level: O0

void __thiscall
VSInterface::VSInDelegator::Read
          (VSInDelegator *this,char *name,vector<bool,_std::allocator<bool>_> *output)

{
  int iVar1;
  int64_t iVar2;
  int local_28;
  int i;
  int size;
  vector<bool,_std::allocator<bool>_> *output_local;
  char *name_local;
  VSInDelegator *this_local;
  
  iVar1 = (*this->_vsapi->propNumElements)(this->_in,name);
  if (-1 < iVar1) {
    std::vector<bool,_std::allocator<bool>_>::clear(output);
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      iVar2 = (*this->_vsapi->propGetInt)(this->_in,name,local_28,&this->_err);
      std::vector<bool,_std::allocator<bool>_>::push_back(output,iVar2 != 0);
    }
  }
  return;
}

Assistant:

void Read(const char* name, std::vector<bool>& output) override {
      auto size = _vsapi->propNumElements(_in, name);
      if (size < 0) return;
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(_vsapi->propGetInt(_in, name, i, &_err));
    }